

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O2

void secp256k1_hmac_sha256_initialize(secp256k1_hmac_sha256 *hash,uchar *key,size_t keylen)

{
  long lVar1;
  uchar rkey [64];
  
  rkey._0_8_ = *(undefined8 *)key;
  rkey._8_8_ = *(undefined8 *)(key + 8);
  rkey._16_8_ = *(undefined8 *)(key + 0x10);
  rkey._24_8_ = *(undefined8 *)(key + 0x18);
  rkey[0x20] = '\0';
  rkey[0x21] = '\0';
  rkey[0x22] = '\0';
  rkey[0x23] = '\0';
  rkey[0x24] = '\0';
  rkey[0x25] = '\0';
  rkey[0x26] = '\0';
  rkey[0x27] = '\0';
  rkey[0x28] = '\0';
  rkey[0x29] = '\0';
  rkey[0x2a] = '\0';
  rkey[0x2b] = '\0';
  rkey[0x2c] = '\0';
  rkey[0x2d] = '\0';
  rkey[0x2e] = '\0';
  rkey[0x2f] = '\0';
  rkey[0x30] = '\0';
  rkey[0x31] = '\0';
  rkey[0x32] = '\0';
  rkey[0x33] = '\0';
  rkey[0x34] = '\0';
  rkey[0x35] = '\0';
  rkey[0x36] = '\0';
  rkey[0x37] = '\0';
  rkey[0x38] = '\0';
  rkey[0x39] = '\0';
  rkey[0x3a] = '\0';
  rkey[0x3b] = '\0';
  rkey[0x3c] = '\0';
  rkey[0x3d] = '\0';
  rkey[0x3e] = '\0';
  rkey[0x3f] = '\0';
  secp256k1_sha256_initialize(&hash->outer);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    rkey[lVar1] = rkey[lVar1] ^ 0x5c;
  }
  secp256k1_sha256_write(&hash->outer,rkey,0x40);
  secp256k1_sha256_initialize(&hash->inner);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    rkey[lVar1] = rkey[lVar1] ^ 0x6a;
  }
  secp256k1_sha256_write(&hash->inner,rkey,0x40);
  return;
}

Assistant:

static void secp256k1_hmac_sha256_initialize(secp256k1_hmac_sha256 *hash, const unsigned char *key, size_t keylen) {
    size_t n;
    unsigned char rkey[64];
    if (keylen <= sizeof(rkey)) {
        memcpy(rkey, key, keylen);
        memset(rkey + keylen, 0, sizeof(rkey) - keylen);
    } else {
        secp256k1_sha256 sha256;
        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, key, keylen);
        secp256k1_sha256_finalize(&sha256, rkey);
        memset(rkey + 32, 0, 32);
    }

    secp256k1_sha256_initialize(&hash->outer);
    for (n = 0; n < sizeof(rkey); n++) {
        rkey[n] ^= 0x5c;
    }
    secp256k1_sha256_write(&hash->outer, rkey, sizeof(rkey));

    secp256k1_sha256_initialize(&hash->inner);
    for (n = 0; n < sizeof(rkey); n++) {
        rkey[n] ^= 0x5c ^ 0x36;
    }
    secp256k1_sha256_write(&hash->inner, rkey, sizeof(rkey));
    secp256k1_memclear(rkey, sizeof(rkey));
}